

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cdr.cpp
# Opt level: O0

Cdr * __thiscall eprosima::fastcdr::Cdr::serialize(Cdr *this,float float_t)

{
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  char **message;
  Cdr *in_RDI;
  char *dst;
  size_t sizeAligned;
  size_t align;
  size_t in_stack_ffffffffffffff78;
  _FastBuffer_iterator *in_stack_ffffffffffffff88;
  Cdr *in_stack_ffffffffffffff90;
  _FastBuffer_iterator local_68;
  _FastBuffer_iterator local_58;
  char *local_48;
  char *minSizeInc;
  Cdr *in_stack_ffffffffffffffc8;
  undefined4 local_c;
  
  minSizeInc = local_48;
  sVar2 = alignment(in_stack_ffffffffffffff90,(size_t)in_stack_ffffffffffffff88);
  sVar3 = _FastBuffer_iterator::operator-(&in_RDI->m_lastPosition,&in_RDI->m_currentPosition);
  if (sVar3 < sVar2 + 4) {
    bVar1 = resize(in_stack_ffffffffffffffc8,(size_t)minSizeInc);
    if (!bVar1) {
      message = (char **)__cxa_allocate_exception(0x28);
      exception::NotEnoughMemoryException::NotEnoughMemoryException
                ((NotEnoughMemoryException *)in_RDI,message);
      __cxa_throw(message,&exception::NotEnoughMemoryException::typeinfo,
                  exception::NotEnoughMemoryException::~NotEnoughMemoryException);
    }
  }
  in_RDI->m_lastDataSize = 4;
  makeAlign(in_RDI,in_stack_ffffffffffffff78);
  if ((in_RDI->m_swapBytes & 1U) == 0) {
    _FastBuffer_iterator::operator<<(&in_RDI->m_currentPosition,(float *)&local_c);
    _FastBuffer_iterator::operator+=(&in_RDI->m_currentPosition,4);
  }
  else {
    _FastBuffer_iterator::operator++(in_stack_ffffffffffffff88,(int)((ulong)in_RDI >> 0x20));
    _FastBuffer_iterator::operator<<
              ((_FastBuffer_iterator *)&stack0xffffffffffffffc8,(char *)((long)&local_c + 3));
    _local_48 = _FastBuffer_iterator::operator++
                          (in_stack_ffffffffffffff88,(int)((ulong)in_RDI >> 0x20));
    _FastBuffer_iterator::operator<<((_FastBuffer_iterator *)&local_48,(char *)((long)&local_c + 2))
    ;
    local_58 = _FastBuffer_iterator::operator++
                         (in_stack_ffffffffffffff88,(int)((ulong)in_RDI >> 0x20));
    _FastBuffer_iterator::operator<<(&local_58,(char *)((long)&local_c + 1));
    local_68 = _FastBuffer_iterator::operator++
                         (in_stack_ffffffffffffff88,(int)((ulong)in_RDI >> 0x20));
    _FastBuffer_iterator::operator<<(&local_68,(char *)&local_c);
  }
  return in_RDI;
}

Assistant:

Cdr& Cdr::serialize(const float float_t)
{
    size_t align = alignment(sizeof(float_t));
    size_t sizeAligned = sizeof(float_t) + align;

    if(((m_lastPosition - m_currentPosition) >= sizeAligned) || resize(sizeAligned))
    {
        // Save last datasize.
        m_lastDataSize = sizeof(float_t);

        // Align.
        makeAlign(align);

        if(m_swapBytes)
        {
            const char *dst = reinterpret_cast<const char*>(&float_t);

            m_currentPosition++ << dst[3];
            m_currentPosition++ << dst[2];
            m_currentPosition++ << dst[1];
            m_currentPosition++ << dst[0];
        }
        else
        {
            m_currentPosition << float_t;
            m_currentPosition += sizeof(float_t);
        }

        return *this;
    }

    throw NotEnoughMemoryException(NotEnoughMemoryException::NOT_ENOUGH_MEMORY_MESSAGE_DEFAULT);
}